

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O2

int fiobj_task_wrapper(FIOBJ o,void *p_)

{
  int iVar1;
  fiobj_object_vtable_s *pfVar2;
  
  *(long *)((long)p_ + 0x20) = *(long *)((long)p_ + 0x20) + 1;
  iVar1 = (**p_)(o,*(undefined8 *)((long)p_ + 8));
  if (iVar1 == -1) {
    *(undefined1 *)((long)p_ + 0x28) = 1;
  }
  else {
    if ((~(uint)o & 6) == 0) {
      return 0;
    }
    if (o == 0) {
      return 0;
    }
    if ((o & 1) != 0) {
      return 0;
    }
    pfVar2 = fiobj_type_vtable(o);
    if (pfVar2->each == (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
      return 0;
    }
    *(undefined1 *)((long)p_ + 0x29) = 1;
    *(FIOBJ *)((long)p_ + 0x18) = o;
  }
  return -1;
}

Assistant:

static int fiobj_task_wrapper(FIOBJ o, void *p_) {
  struct task_packet_s *p = p_;
  ++p->counter;
  int ret = p->task(o, p->arg);
  if (ret == -1) {
    p->stop = 1;
    return -1;
  }
  if (FIOBJ_IS_ALLOCATED(o) && FIOBJECT2VTBL(o)->each) {
    p->incomplete = 1;
    p->next = o;
    return -1;
  }
  return 0;
}